

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O0

Pda * namingConventions::makeNamePda(string *name)

{
  char cVar1;
  Node *pNVar2;
  Node *pNVar3;
  bool bVar4;
  bool bVar5;
  Pda *this;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *pvVar10;
  size_type sVar11;
  const_reference ppNVar12;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *pvVar13;
  string local_1e8;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  uint local_dc;
  reference pcStack_d8;
  uint i;
  char *ch;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  undefined1 local_b0 [7];
  bool present;
  string local_90;
  undefined1 local_70 [8];
  string nodename;
  string local_48 [4];
  uint c;
  string alphabeth;
  Pda *p;
  string *name_local;
  
  this = (Pda *)operator_new(0x90);
  Pda::Pda(this);
  std::__cxx11::string::string(local_48);
  nodename.field_2._12_4_ = 0;
  while( true ) {
    uVar6 = (ulong)(uint)nodename.field_2._12_4_;
    lVar7 = std::__cxx11::string::size();
    if (lVar7 + 1U <= uVar6) break;
    std::__cxx11::to_string(&local_90,nodename.field_2._12_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,"q"
                   ,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)local_b0,(string *)local_70);
    uVar6 = (ulong)(uint)nodename.field_2._12_4_;
    uVar8 = std::__cxx11::string::size();
    Pda::addNode(this,(string *)local_b0,uVar6 == 0,uVar6 == uVar8);
    std::__cxx11::string::~string((string *)local_b0);
    bVar4 = false;
    __end2._M_current = (char *)std::__cxx11::string::begin();
    ch = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&ch);
      if (!bVar5) break;
      pcStack_d8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end2);
      cVar1 = *pcStack_d8;
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)name);
      if (cVar1 == *pcVar9) {
        bVar4 = true;
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    if (!bVar4) {
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)name);
      std::__cxx11::string::operator+=(local_48,*pcVar9);
    }
    std::__cxx11::string::~string((string *)local_70);
    nodename.field_2._12_4_ = nodename.field_2._12_4_ + 1;
  }
  local_dc = 0;
  while( true ) {
    uVar6 = (ulong)local_dc;
    pvVar10 = Pda::getAllNodes(this);
    sVar11 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::size(pvVar10);
    if (sVar11 - 1 <= uVar6) break;
    pvVar10 = Pda::getAllNodes(this);
    ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[]
                         (pvVar10,(ulong)local_dc);
    pNVar2 = *ppNVar12;
    pvVar10 = Pda::getAllNodes(this);
    ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[]
                         (pvVar10,(ulong)(local_dc + 1));
    pNVar3 = *ppNVar12;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100," ",&local_101);
    pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)name);
    Pda::addFunct(this,pNVar2,pNVar3,' ',&local_100,*pcVar9);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    local_dc = local_dc + 1;
  }
  pvVar10 = Pda::getAllNodes(this);
  ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[](pvVar10,0);
  pNVar2 = *ppNVar12;
  pvVar10 = Pda::getAllNodes(this);
  ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[](pvVar10,0);
  pNVar3 = *ppNVar12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128," ",&local_129);
  Pda::addFunct(this,pNVar2,pNVar3,' ',&local_128,' ');
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  pvVar10 = Pda::getAllNodes(this);
  pvVar13 = Pda::getAllNodes(this);
  sVar11 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::size(pvVar13);
  ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[]
                       (pvVar10,sVar11 - 1);
  pNVar2 = *ppNVar12;
  pvVar10 = Pda::getAllNodes(this);
  pvVar13 = Pda::getAllNodes(this);
  sVar11 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::size(pvVar13);
  ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[]
                       (pvVar10,sVar11 - 1);
  pNVar3 = *ppNVar12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150," ",&local_151);
  Pda::addFunct(this,pNVar2,pNVar3,' ',&local_150,' ');
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  pvVar10 = Pda::getAllNodes(this);
  pvVar13 = Pda::getAllNodes(this);
  sVar11 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::size(pvVar13);
  ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[]
                       (pvVar10,sVar11 - 1);
  pNVar2 = *ppNVar12;
  pvVar10 = Pda::getAllNodes(this);
  pvVar13 = Pda::getAllNodes(this);
  sVar11 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::size(pvVar13);
  ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[]
                       (pvVar10,sVar11 - 1);
  pNVar3 = *ppNVar12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178," ",&local_179);
  Pda::addFunct(this,pNVar2,pNVar3,' ',&local_178,'(');
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  pvVar10 = Pda::getAllNodes(this);
  pvVar13 = Pda::getAllNodes(this);
  sVar11 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::size(pvVar13);
  ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[]
                       (pvVar10,sVar11 - 1);
  pNVar2 = *ppNVar12;
  pvVar10 = Pda::getAllNodes(this);
  pvVar13 = Pda::getAllNodes(this);
  sVar11 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::size(pvVar13);
  ppNVar12 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator[]
                       (pvVar10,sVar11 - 1);
  pNVar3 = *ppNVar12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0," ",&local_1a1);
  Pda::addFunct(this,pNVar2,pNVar3,' ',&local_1a0,')');
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::string((string *)&local_1c8,local_48);
  Pda::setAlphabet(this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string((string *)&local_1e8,local_48);
  Pda::setStackAlphabet(this,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string(local_48);
  return this;
}

Assistant:

Pda *namingConventions::makeNamePda(std::string &name) {
    Pda *p = new Pda();
    std::string alphabeth;
    for (unsigned int c = 0; c < name.size() + 1; ++c) {
        std::string nodename = "q" + std::to_string(c);
        p->addNode(nodename, c == 0, c == name.size());
        bool present = false;
        for (char &ch: alphabeth) {
            if (ch == name[c]) {
                present = true;
            }
        }
        if (!present) {
            alphabeth += name[c];
        }
    }
    for (unsigned int i = 0; i < p->getAllNodes().size() - 1; ++i) {
        p->addFunct(p->getAllNodes()[i], p->getAllNodes()[i + 1], ' ', " ", name[i]);
    }
    p->addFunct(p->getAllNodes()[0], p->getAllNodes()[0], ' ', " ", ' ');
    p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
                " ", ' ');
  p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
              " ", '(');
  p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
              " ", ')');


    p->setAlphabet(alphabeth);
    p->setStackAlphabet(alphabeth);
    return p;
}